

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O2

ModelComponent * __thiscall
lsim::ModelCircuit::create_component
          (ModelCircuit *this,char *circuit_name,uint32_t input_pins,uint32_t output_pins)

{
  uint __val;
  __single_object this_00;
  __single_object __p;
  __uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> *this_01;
  long lVar1;
  char *in_stack_ffffffffffffff58;
  _Head_base<0UL,_lsim::Property_*,_false> in_stack_ffffffffffffff60;
  __single_object component;
  string local_90;
  char *local_70 [4];
  char *circuit_name_local;
  uint32_t output_pins_local;
  uint32_t input_pins_local;
  string local_40 [32];
  
  local_70[0]._0_4_ = this->m_component_id;
  this->m_component_id = (uint32_t)local_70[0] + 1;
  local_90._M_dataplus._M_p = (pointer)this;
  circuit_name_local = circuit_name;
  output_pins_local = output_pins;
  input_pins_local = input_pins;
  std::
  make_unique<lsim::ModelComponent,lsim::ModelCircuit*,unsigned_int,char_const*&,unsigned_int&,unsigned_int&>
            ((ModelCircuit **)&component,(uint *)&local_90,local_70,(uint *)&circuit_name_local,
             &input_pins_local);
  this_00 = component;
  local_90._M_dataplus._M_p._0_4_ =
       *(undefined4 *)
        ((long)component._M_t.
               super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
               .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl + 8);
  this_01 = (__uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->m_components,(key_type *)&local_90);
  __p = component;
  component._M_t.
  super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>._M_t.
  super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>.
  super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl =
       (__uniq_ptr_data<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>,_true,_true>
       )(__uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>)0x0;
  std::__uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::reset
            (this_01,(pointer)__p._M_t.
                              super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
                              .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl);
  make_property((char *)in_stack_ffffffffffffff60._M_head_impl,false);
  ModelComponent::add_property
            ((ModelComponent *)
             this_00._M_t.
             super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
             ._M_t.
             super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
             .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl,(uptr_t *)&local_90)
  ;
  if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::string(local_40,circuit_name_local,(allocator *)&stack0xffffffffffffff5f);
  __val = *(uint *)((long)this_00._M_t.
                          super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
                          .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl + 8);
  lVar1 = std::__cxx11::string::find((char)local_40,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)local_70,local_40);
  }
  else {
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_40);
  }
  std::__cxx11::string::append((char *)local_70);
  std::__cxx11::to_string(&local_90,__val);
  std::__cxx11::string::append((string *)local_70);
  std::__cxx11::string::~string((string *)&local_90);
  make_property((char *)in_stack_ffffffffffffff60._M_head_impl,in_stack_ffffffffffffff58);
  ModelComponent::add_property
            ((ModelComponent *)
             this_00._M_t.
             super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
             ._M_t.
             super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
             .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl,
             (uptr_t *)&stack0xffffffffffffff60);
  if (in_stack_ffffffffffffff60._M_head_impl != (Property *)0x0) {
    (*(in_stack_ffffffffffffff60._M_head_impl)->_vptr_Property[1])();
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_40);
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::~unique_ptr
            (&component);
  return (ModelComponent *)
         (__uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>)
         this_00._M_t.
         super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>.
         _M_t.
         super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>.
         super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl;
}

Assistant:

ModelComponent *ModelCircuit::create_component(const char *circuit_name, uint32_t input_pins, uint32_t output_pins) {
    auto component = std::make_unique<ModelComponent>(this, m_component_id++, circuit_name, input_pins, output_pins);
    auto result = component.get();
    m_components[result->id()] = std::move(component);
    result->add_property(make_property("flip", false));
    result->add_property(make_property("caption", unique_subcircuit_name(circuit_name, result->id()).c_str()));
    return result;
}